

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

int cmp_gram_wids(BuilderGram_T *gram1,BuilderGram_T *gram2,uint32_t order)

{
  uint local_28;
  uint32_t i;
  uint32_t order_local;
  BuilderGram_T *gram2_local;
  BuilderGram_T *gram1_local;
  
  local_28 = 0;
  while( true ) {
    if (order <= local_28) {
      return 0;
    }
    if (gram2->wids[local_28] < gram1->wids[local_28]) break;
    if (gram1->wids[local_28] < gram2->wids[local_28]) {
      return -1;
    }
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

static inline int cmp_gram_wids(BuilderGram_T* gram1, BuilderGram_T* gram2, uint32_t order){
    for (uint32_t i = 0;i<order;i++) {
        if (gram1->wids[i] > gram2->wids[i]) {
            return 1;
        }else if(gram1->wids[i] < gram2->wids[i]){
            return -1;
        }
    }
    return 0;
}